

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::
     bitfield_extract_invalid_bits_type(NegativeTestContext *ctx)

{
  ShaderType shaderType;
  DataType offsetDataType;
  NegativeTestContext *ctx_00;
  bool bVar1;
  char *__s;
  long lVar2;
  long lVar3;
  long lVar4;
  DataType in_stack_ffffffffffffff18;
  allocator<char> local_d9;
  NegativeTestContext *local_d8;
  ShaderType local_cc;
  long local_c8;
  string shaderSource;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"bitfieldExtract: Invalid bits type.",
             (allocator<char> *)&local_90);
  local_d8 = ctx;
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  ctx_00 = local_d8;
  for (lVar4 = 0; lVar4 != 6; lVar4 = lVar4 + 1) {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar4];
    bVar1 = NegativeTestContext::isShaderSupported(local_d8,shaderType);
    if (bVar1) {
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_d9);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(local_d8,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      lVar2 = 0;
      while (lVar2 != 4) {
        local_cc = deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[lVar2];
        local_c8 = lVar2;
        for (lVar3 = 0; lVar3 != 0x2c; lVar3 = lVar3 + 4) {
          offsetDataType =
               *(DataType *)
                ((long)&NegativeTestShared::(anonymous_namespace)::s_nonScalarIntTypes + lVar3);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceBitfieldExtract_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx_00,
                     (NegativeTestContext *)(ulong)shaderType,local_cc,TYPE_INT,offsetDataType,
                     in_stack_ffffffffffffff18);
          std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
          verifyShader(ctx_00,shaderType,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          std::__cxx11::string::~string((string *)&shaderSource);
          NegativeTestShared::(anonymous_namespace)::genShaderSourceBitfieldExtract_abi_cxx11_
                    (&shaderSource,(_anonymous_namespace_ *)ctx_00,
                     (NegativeTestContext *)(ulong)shaderType,
                     deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes[local_c8],
                     TYPE_INT,offsetDataType,in_stack_ffffffffffffff18);
          std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
          verifyShader(ctx_00,shaderType,&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&shaderSource);
        }
        lVar2 = local_c8 + 1;
      }
      NegativeTestContext::endSection(local_d8);
    }
  }
  NegativeTestContext::endSection(local_d8);
  return;
}

Assistant:

void bitfield_extract_invalid_bits_type (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_intTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));

	ctx.beginSection("bitfieldExtract: Invalid bits type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				for (int nonIntNdx = 0; nonIntNdx < DE_LENGTH_OF_ARRAY(s_nonScalarIntTypes); ++nonIntNdx)
				{
					{
						const std::string shaderSource(genShaderSourceBitfieldExtract(ctx, s_shaders[shaderNdx], s_intTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[nonIntNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
					{
						const std::string shaderSource(genShaderSourceBitfieldExtract(ctx, s_shaders[shaderNdx], s_uintTypes[dataTypeNdx], glu::TYPE_INT, s_nonScalarIntTypes[nonIntNdx]));
						verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
					}
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}